

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O1

void __thiscall OpenMD::FluctuatingChargeNVE::moveB(FluctuatingChargeNVE *this)

{
  pointer ppAVar1;
  DataStoragePointer DVar2;
  Snapshot *pSVar3;
  long lVar4;
  Molecule *pMVar5;
  pointer ppAVar6;
  Atom *pAVar7;
  long lVar8;
  MoleculeIterator i;
  MoleculeIterator local_18;
  
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    local_18._M_node = (_Base_ptr)0x0;
    pMVar5 = SimInfo::beginMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
    while (pMVar5 != (Molecule *)0x0) {
      ppAVar6 = (pMVar5->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar1 = (pMVar5->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar6 == ppAVar1) {
        pAVar7 = (Atom *)0x0;
      }
      else {
        pAVar7 = *ppAVar6;
      }
      while (pAVar7 != (Atom *)0x0) {
        ppAVar6 = ppAVar6 + 1;
        DVar2 = (pAVar7->super_StuntDouble).storage_;
        pSVar3 = ((pAVar7->super_StuntDouble).snapshotMan_)->currentSnapshot_;
        lVar8 = (long)(pAVar7->super_StuntDouble).localIndex_;
        lVar4 = *(long *)((long)&(pSVar3->atomData).flucQVel.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + DVar2);
        *(double *)(lVar4 + lVar8 * 8) =
             (*(double *)
               (*(long *)((long)&(pSVar3->atomData).flucQFrc.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + DVar2) + lVar8 * 8) * this->dt2_
             ) / pAVar7->chargeMass_ + *(double *)(lVar4 + lVar8 * 8);
        if (ppAVar6 == ppAVar1) {
          pAVar7 = (Atom *)0x0;
        }
        else {
          pAVar7 = *ppAVar6;
        }
      }
      pMVar5 = SimInfo::nextMolecule((this->super_FluctuatingChargePropagator).info_,&local_18);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeNVE::moveB() {
    if (!hasFlucQ_) return;
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cfrc, cvel, cmass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel  = atom->getFlucQVel();
        cfrc  = atom->getFlucQFrc();
        cmass = atom->getChargeMass();

        // velocity half step
        cvel += dt2_ * cfrc / cmass;
        atom->setFlucQVel(cvel);
      }
    }
  }